

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O0

void zt_log_close(zt_log_ty *log)

{
  zt_log_ty *in_RDI;
  
  if (in_RDI != (zt_log_ty *)0x0) {
    if (in_RDI == log_default_ptr) {
      zt_log_set_logger(log);
    }
    if (in_RDI->vtbl->destructor != (_func_void_zt_log_ty_ptr *)0x0) {
      (*in_RDI->vtbl->destructor)(in_RDI);
    }
  }
  return;
}

Assistant:

void
zt_log_close(zt_log_ty * log) {
    if (!log) {
        return;
    }

    if (log == log_default_ptr) {
        zt_log_set_logger(NULL);
    }

    if (log->vtbl->destructor) {
        log->vtbl->destructor(log);
    }
}